

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::operator*(Matrix *__return_storage_ptr__,Matrix *this,Matrix *mat)

{
  pointer pvVar1;
  long lVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  pointer pvVar11;
  double dVar12;
  
  if ((this->m_shape).field_0.m_dims[1] == (mat->m_shape).field_0.m_dims[0]) {
    Matrix(__return_storage_ptr__,(this->m_shape).field_0.m_dims[0],(mat->m_shape).field_0.m_dims[1]
          );
    uVar7 = (this->m_shape).field_0.m_dims[0];
    if (uVar7 != 0) {
      pvVar1 = (__return_storage_ptr__->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (ulong)(mat->m_shape).field_0.m_dims[1];
      uVar6 = 0;
      do {
        iVar9 = (int)uVar10;
        uVar10 = 0;
        if (iVar9 != 0) {
          lVar2 = *(long *)&pvVar1[uVar6].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          pvVar3 = (this->m_vals).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar4 = (mat->m_vals).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = 0;
          do {
            *(undefined8 *)(lVar2 + uVar8 * 8) = 0;
            if ((this->m_shape).field_0.m_dims[1] != 0) {
              lVar5 = *(long *)&pvVar3[uVar6].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl;
              dVar12 = 0.0;
              uVar10 = 0;
              pvVar11 = pvVar4;
              do {
                dVar12 = dVar12 + *(double *)(lVar5 + uVar10 * 8) *
                                  *(double *)
                                   (*(long *)&(pvVar11->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl + uVar8 * 8);
                *(double *)(lVar2 + uVar8 * 8) = dVar12;
                uVar10 = uVar10 + 1;
                pvVar11 = pvVar11 + 1;
              } while (uVar10 < (this->m_shape).field_0.m_dims[1]);
            }
            uVar8 = uVar8 + 1;
            uVar10 = (ulong)(mat->m_shape).field_0.m_dims[1];
          } while (uVar8 < uVar10);
          uVar7 = (this->m_shape).field_0.m_dims[0];
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar7);
    }
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [* operator]: Shape doesn\'t match!\n");
  exit(1);
}

Assistant:

Matrix Matrix::operator*(const Matrix& mat) const{
    if(m_shape.n_col!=mat.m_shape.n_row){
        std::cout<<"ERROR [* operator]: Shape doesn't match!\n";
        exit(1);
    }
    Matrix result(m_shape.n_row, mat.m_shape.n_col);
    
    for(uint i=0;i<m_shape.n_row;++i){
        for(uint t=0;t<mat.m_shape.n_col;++t){
            result.m_vals[i][t]=0;
            for(uint j=0;j<m_shape.n_col;++j){
                result.m_vals[i][t]+=m_vals[i][j]*mat.m_vals[j][t];
            }
        }
    }
    // std::cout<<"+\n";
    return result;
}